

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDUtils.cpp
# Opt level: O2

string * GetRegisterName_abi_cxx11_(string *__return_storage_ptr__,SWDRegisters reg)

{
  char *pcVar1;
  allocator local_9;
  
  switch(reg) {
  case SWDR_DP_IDCODE:
    pcVar1 = "IDCODE";
    break;
  case SWDR_DP_ABORT:
    pcVar1 = "ABORT";
    break;
  case SWDR_DP_CTRL_STAT:
    pcVar1 = "CTRL/STAT";
    break;
  case SWDR_DP_WCR:
    pcVar1 = "WCR";
    break;
  case SWDR_DP_RESEND:
    pcVar1 = "RESEND";
    break;
  case SWDR_DP_SELECT:
    pcVar1 = "SELECT";
    break;
  case SWDR_DP_RDBUFF:
    pcVar1 = "RDBUFF";
    break;
  case SWDR_DP_ROUTESEL:
    pcVar1 = "ROUTESEL";
    break;
  case SWDR_AP_CSW:
    pcVar1 = "CSW";
    break;
  case SWDR_AP_TAR:
    pcVar1 = "TAR";
    break;
  case SWDR_AP_DRW:
    pcVar1 = "DRW";
    break;
  case SWDR_AP_BD0:
    pcVar1 = "BD0";
    break;
  case SWDR_AP_BD1:
    pcVar1 = "BD1";
    break;
  case SWDR_AP_BD2:
    pcVar1 = "BD2";
    break;
  case SWDR_AP_BD3:
    pcVar1 = "BD3";
    break;
  case SWDR_AP_CFG:
    pcVar1 = "CFG";
    break;
  case SWDR_AP_BASE:
    pcVar1 = "BASE";
    break;
  case SWDR_AP_RAZ_WI:
    pcVar1 = "RAZ_WI";
    break;
  case SWDR_AP_IDR:
    pcVar1 = "IDR";
    break;
  default:
    pcVar1 = "??";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string GetRegisterName( SWDRegisters reg )
{
    switch( reg )
    {
    case SWDR_DP_IDCODE:
        return "IDCODE";
    case SWDR_DP_ABORT:
        return "ABORT";
    case SWDR_DP_CTRL_STAT:
        return "CTRL/STAT";
    case SWDR_DP_WCR:
        return "WCR";
    case SWDR_DP_RESEND:
        return "RESEND";
    case SWDR_DP_SELECT:
        return "SELECT";
    case SWDR_DP_RDBUFF:
        return "RDBUFF";
    case SWDR_DP_ROUTESEL:
        return "ROUTESEL";

    case SWDR_AP_CSW:
        return "CSW";
    case SWDR_AP_TAR:
        return "TAR";
    case SWDR_AP_DRW:
        return "DRW";
    case SWDR_AP_BD0:
        return "BD0";
    case SWDR_AP_BD1:
        return "BD1";
    case SWDR_AP_BD2:
        return "BD2";
    case SWDR_AP_BD3:
        return "BD3";
    case SWDR_AP_CFG:
        return "CFG";
    case SWDR_AP_BASE:
        return "BASE";
    case SWDR_AP_RAZ_WI:
        return "RAZ_WI";
    case SWDR_AP_IDR:
        return "IDR";
    }

    return "??";
}